

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O3

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnCallExpr
          (BinaryReaderInterp *this,Index func_index)

{
  Result RVar1;
  Enum EVar2;
  Enum op;
  Location loc_1;
  Location loc;
  Location local_b8;
  Location local_98;
  Var local_78;
  
  local_98.field_1.field_0.last_column = 0;
  local_98.filename._M_len = (this->filename_)._M_len;
  local_98.filename._M_str = (this->filename_)._M_str;
  local_b8.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_b8.field_1.field_0.last_column = 0;
  local_b8.filename._M_len = (this->filename_)._M_len;
  local_b8.filename._M_str = (this->filename_)._M_str;
  local_98.field_1.field_1.offset = local_b8.field_1.field_1.offset;
  Var::Var(&local_78,func_index,&local_b8);
  RVar1 = SharedValidator::OnCall(&this->validator_,&local_98,&local_78);
  Var::~Var(&local_78);
  EVar2 = Error;
  if (RVar1.enum_ != Error) {
    op = Call;
    if (func_index <
        (uint)((int)((ulong)((long)(this->func_types_).
                                   super__Vector_base<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->func_types_).
                                  super__Vector_base<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 6) +
              (int)((ulong)((long)(this->module_->funcs).
                                  super__Vector_base<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->module_->funcs).
                                 super__Vector_base<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x11111111)) {
      op = InterpCallImport;
    }
    Istream::Emit(this->istream_,op,func_index);
    EVar2 = Ok;
  }
  return (Result)EVar2;
}

Assistant:

Result BinaryReaderInterp::OnCallExpr(Index func_index) {
  CHECK_RESULT(
      validator_.OnCall(GetLocation(), Var(func_index, GetLocation())));

  if (func_index >= num_func_imports()) {
    istream_.Emit(Opcode::Call, func_index);
  } else {
    istream_.Emit(Opcode::InterpCallImport, func_index);
  }

  return Result::Ok;
}